

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

shared_ptr<pbrt::syntactic::Texture> __thiscall
pbrt::syntactic::Attributes::findNamedTexture(Attributes *this,string *name)

{
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pbrt::syntactic::Texture> sVar1;
  undefined1 local_48 [56];
  
  local_48._0_8_ = (pointer)0x0;
  local_48._8_8_ = 0;
  std::__cxx11::string::string((string *)(local_48 + 0x18),in_RDX);
  findNamedItem<std::shared_ptr<pbrt::syntactic::Texture>>
            (this,(shared_ptr<pbrt::syntactic::Texture> *)name,(string *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  sVar1.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pbrt::syntactic::Texture>)
         sVar1.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> findNamedTexture(std::string name) {
        return findNamedItem(std::shared_ptr<Texture>{}, name);
      }